

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_doc(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_50;
  xmlAttrPtr attr;
  xmlDocPtr res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:doc",&cur);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_50 = (xmlChar *)0x0;
    }
    else {
      local_50 = cur->name;
    }
    switch(*(undefined4 *)(local_50 + 8)) {
    case 2:
      attr = *(xmlAttrPtr *)(local_50 + 0x40);
      break;
    default:
      attr = *(xmlAttrPtr *)(local_50 + 0x40);
      break;
    case 9:
    case 0xd:
    case 0x15:
      attr = (xmlAttrPtr)0x0;
      break;
    case 0x12:
      attr = (xmlAttrPtr)0x0;
    }
    self_local = libxml_xmlDocPtrWrap((xmlDocPtr)attr);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_doc(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlDocPtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:doc", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

#ifdef DEBUG
    printf("libxml_doc: cur = %p\n", cur);
#endif

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
        case XML_HTML_DOCUMENT_NODE:
            res = NULL;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->doc;
                break;
            }
        case XML_NAMESPACE_DECL:
            res = NULL;
            break;
        default:
            res = cur->doc;
            break;
    }
    resultobj = libxml_xmlDocPtrWrap(res);
    return resultobj;
}